

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::calculateEdgeLogLikelihoods
          (BeagleCPUImpl<double,_2,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int count,double *outSumLogLikelihood,double *outSumFirstDerivative,
          double *outSumSecondDerivative)

{
  undefined4 *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long *in_RDI;
  undefined4 *in_R8;
  undefined4 *in_R9;
  undefined4 *in_stack_00000008;
  undefined4 *in_stack_00000010;
  undefined4 *in_stack_00000018;
  int in_stack_00000020;
  double *in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  int i;
  int scalingIndices_2 [1];
  int scalingIndices_1 [1];
  int scalingIndices [2];
  int child2ScalingIndex;
  int child1ScalingIndex;
  int cumulativeScalingFactorIndex;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 uVar1;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar2;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 *local_50;
  undefined4 *local_48;
  int *local_40;
  int *local_38;
  int local_24;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_58 = in_R9;
  local_50 = in_R8;
  local_48 = in_RCX;
  local_40 = in_RDX;
  local_38 = in_RSI;
  if (in_stack_00000020 == 1) {
    if ((in_RDI[0xb] & 0x80U) == 0) {
      if ((in_RDI[0xb] & 0x100U) == 0) {
        local_5c = *in_stack_00000018;
      }
      else {
        local_5c = *(undefined4 *)((long)in_RDI + 0x44);
        local_60 = *in_RSI - (int)in_RDI[2];
        local_64 = *in_RDX - (int)in_RDI[2];
        (**(code **)(*in_RDI + 0x120))(in_RDI,local_5c);
        if ((local_60 < 0) || (local_64 < 0)) {
          if (local_60 < 0) {
            if (-1 < local_64) {
              local_74 = local_64;
              (**(code **)(*in_RDI + 0x100))(in_RDI,&local_74,1,local_5c);
            }
          }
          else {
            local_70 = local_60;
            (**(code **)(*in_RDI + 0x100))(in_RDI,&local_70,1,local_5c);
          }
        }
        else {
          local_6c = local_60;
          local_68 = local_64;
          (**(code **)(*in_RDI + 0x100))(in_RDI,&local_6c,2,local_5c);
        }
      }
    }
    else {
      local_5c = 0;
    }
    if ((local_50 == (undefined4 *)0x0) && (local_58 == (undefined4 *)0x0)) {
      if ((*(byte *)((long)in_RDI + 0x13e) & 1) == 0) {
        local_24 = (**(code **)(*in_RDI + 0x260))
                             (in_RDI,*local_38,*local_40,*local_48,*in_stack_00000008,
                              *in_stack_00000010,local_5c,in_stack_00000028);
      }
      else {
        (**(code **)(*in_RDI + 0x270))
                  (in_RDI,local_38,local_40,local_48,in_stack_00000008,in_stack_00000010,
                   in_stack_00000018,in_RDI[0x2c],in_RDI[0x2d]);
        *in_stack_00000028 = 0.0;
        for (local_78 = 0; local_78 < (int)in_RDI[9]; local_78 = local_78 + 1) {
          *in_stack_00000028 = *(double *)(in_RDI[0x2d] + (long)local_78 * 8) + *in_stack_00000028;
        }
        if ((*in_stack_00000028 != *in_stack_00000028) ||
           (NAN(*in_stack_00000028) || NAN(*in_stack_00000028))) {
          local_24 = -8;
        }
        else {
          local_24 = 0;
        }
      }
    }
    else if (local_58 == (undefined4 *)0x0) {
      local_24 = (**(code **)(*in_RDI + 0x290))
                           (in_RDI,*local_38,*local_40,*local_48,*local_50,*in_stack_00000008,
                            *in_stack_00000010,local_5c,in_stack_00000028,in_stack_00000030);
    }
    else {
      local_24 = (**(code **)(*in_RDI + 0x298))
                           (in_RDI,*local_38,*local_40,*local_48,*local_50,*local_58,
                            *in_stack_00000008,*in_stack_00000010,CONCAT44(uVar2,local_5c),
                            in_stack_00000028,in_stack_00000030,in_stack_00000038);
    }
  }
  else {
    if (((in_RDI[0xb] & 0x80U) != 0) || ((in_RDI[0xb] & 0x100U) != 0)) {
      fprintf(_stderr,
              "BeagleCPUImpl::calculateEdgeLogLikelihoods not yet implemented for count > 1 and auto/always scaling\n"
             );
    }
    if ((local_50 == (undefined4 *)0x0) && (local_58 == (undefined4 *)0x0)) {
      local_24 = (**(code **)(*in_RDI + 0x288))
                           (in_RDI,local_38,local_40,local_48,in_stack_00000008,in_stack_00000010,
                            in_stack_00000018,CONCAT44(uVar1,in_stack_00000020),in_stack_00000028);
    }
    else {
      fprintf(_stderr,
              "BeagleCPUImpl::calculateEdgeLogLikelihoods not yet implemented for count > 1 and derivatives\n"
             );
      local_24 = 0;
    }
  }
  return local_24;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateEdgeLogLikelihoods(const int* parentBufferIndices,
                                                             const int* childBufferIndices,
                                                             const int* probabilityIndices,
                                                             const int* firstDerivativeIndices,
                                                             const int* secondDerivativeIndices,
                                                             const int* categoryWeightsIndices,
                                                             const int* stateFrequenciesIndices,
                                                             const int* cumulativeScaleIndices,
                                                             int count,
                                                             double* outSumLogLikelihood,
                                                             double* outSumFirstDerivative,
                                                             double* outSumSecondDerivative) {
    // TODO: implement for count > 1

    if (count == 1) {
        int cumulativeScalingFactorIndex;
        if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
            cumulativeScalingFactorIndex = 0;
        } else if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS) {
            cumulativeScalingFactorIndex = kInternalPartialsBufferCount;
            int child1ScalingIndex = parentBufferIndices[0] - kTipCount;
            int child2ScalingIndex = childBufferIndices[0] - kTipCount;
            resetScaleFactors(cumulativeScalingFactorIndex);
            if (child1ScalingIndex >= 0 && child2ScalingIndex >= 0) {
                int scalingIndices[2] = {child1ScalingIndex, child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 2, cumulativeScalingFactorIndex);
            } else if (child1ScalingIndex >= 0) {
                int scalingIndices[1] = {child1ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, cumulativeScalingFactorIndex);
            } else if (child2ScalingIndex >= 0) {
                int scalingIndices[1] = {child2ScalingIndex};
                accumulateScaleFactors(scalingIndices, 1, cumulativeScalingFactorIndex);
            }
        } else {
            cumulativeScalingFactorIndex = cumulativeScaleIndices[0];
        }
        if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL)

            if (kAutoRootPartitioningEnabled) {
                calcEdgeLogLikelihoodsByAutoPartitionAsync(parentBufferIndices,
                                                           childBufferIndices,
                                                           probabilityIndices,
                                                           categoryWeightsIndices,
                                                           stateFrequenciesIndices,
                                                           cumulativeScaleIndices,
                                                           gAutoPartitionIndices,
                                                           gAutoPartitionOutSumLogLikelihoods);

                *outSumLogLikelihood = 0.0;

                for (int i = 0; i < kPartitionCount; i++) {
                    *outSumLogLikelihood += gAutoPartitionOutSumLogLikelihoods[i];
                }

                if (*outSumLogLikelihood != *outSumLogLikelihood) {
                    return BEAGLE_ERROR_FLOATING_POINT;
                } else {
                    return BEAGLE_SUCCESS;
                }
            } else {
                return calcEdgeLogLikelihoods(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                       categoryWeightsIndices[0], stateFrequenciesIndices[0], cumulativeScalingFactorIndex,
                                       outSumLogLikelihood);
            }
        else if (secondDerivativeIndices == NULL)
            return calcEdgeLogLikelihoodsFirstDeriv(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                             firstDerivativeIndices[0], categoryWeightsIndices[0], stateFrequenciesIndices[0],
                                             cumulativeScalingFactorIndex, outSumLogLikelihood, outSumFirstDerivative);
        else
            return calcEdgeLogLikelihoodsSecondDeriv(parentBufferIndices[0], childBufferIndices[0], probabilityIndices[0],
                                              firstDerivativeIndices[0], secondDerivativeIndices[0], categoryWeightsIndices[0],
                                              stateFrequenciesIndices[0], cumulativeScalingFactorIndex, outSumLogLikelihood,
                                              outSumFirstDerivative, outSumSecondDerivative);
    } else {
        if ((kFlags & BEAGLE_FLAG_SCALING_AUTO) || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
            fprintf(stderr,"BeagleCPUImpl::calculateEdgeLogLikelihoods not yet implemented for count > 1 and auto/always scaling\n");
        }

        if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {
            return calcEdgeLogLikelihoodsMulti(parentBufferIndices, childBufferIndices, probabilityIndices,
                                          categoryWeightsIndices, stateFrequenciesIndices, cumulativeScaleIndices, count,
                                          outSumLogLikelihood);
        } else {
            fprintf(stderr,"BeagleCPUImpl::calculateEdgeLogLikelihoods not yet implemented for count > 1 and derivatives\n");
        }
    }
    return BEAGLE_SUCCESS;
}